

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_extension.cpp
# Opt level: O2

void __thiscall duckdb::ParquetExtension::Load(ParquetExtension *this,DuckDB *db)

{
  type pDVar1;
  FileSystem *pFVar2;
  reference pvVar3;
  DBConfig *this_00;
  long lVar4;
  initializer_list<duckdb::LogicalType> __l;
  allocator_type local_1c6a;
  allocator local_1c69;
  string local_1c68;
  _func_int **local_1c48;
  undefined1 local_1c40 [64];
  LogicalType local_1c00;
  LogicalType local_1be8;
  LogicalType local_1bd0;
  LogicalType local_1bb8;
  LogicalType local_1ba0;
  LogicalType local_1b88;
  LogicalType local_1b70;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_1b58;
  string local_1b40;
  string local_1b20;
  string local_1b00;
  string local_1ae0;
  string local_1ac0;
  TableFunctionSet scan_fun;
  FunctionSet<duckdb::TableFunction> local_1a68;
  FunctionSet<duckdb::TableFunction> local_1a30;
  FunctionSet<duckdb::TableFunction> local_19f8;
  FunctionSet<duckdb::TableFunction> local_19c0;
  FunctionSet<duckdb::TableFunction> local_1988;
  FunctionSet<duckdb::TableFunction> local_1950;
  FunctionSet<duckdb::TableFunction> local_1918;
  PragmaFunction parquet_key_fun;
  CopyFunction function;
  PragmaFunction local_1518;
  TableFunction local_1400;
  ParquetBloomProbeFunction bloom_probe_fun;
  TableFunction local_1090;
  ParquetFileMetadataFunction file_meta_fun;
  TableFunction local_d20;
  ParquetKeyValueMetadataFunction kv_meta_fun;
  TableFunction local_9b0;
  ParquetSchemaFunction schema_fun;
  TableFunction local_640;
  ParquetMetaDataFunction meta_fun;
  CopyFunction local_2d0;
  
  pDVar1 = shared_ptr<duckdb::DatabaseInstance,_true>::operator*(&db->instance);
  pFVar2 = DuckDB::GetFileSystem(db);
  make_uniq<duckdb::ZStdFileSystem>();
  local_1c48 = function.super_Function._vptr_Function;
  function.super_Function._vptr_Function = (_func_int **)0x0;
  (*pFVar2->_vptr_FileSystem[0x1b])(pFVar2,3);
  if (local_1c48 != (_func_int **)0x0) {
    (**(code **)(*local_1c48 + 8))();
  }
  local_1c48 = (_func_int **)0x0;
  if (function.super_Function._vptr_Function != (_func_int **)0x0) {
    (**(code **)(*function.super_Function._vptr_Function + 8))();
  }
  ParquetScanFunction::GetFunctionSet();
  ::std::__cxx11::string::assign((char *)&scan_fun);
  FunctionSet<duckdb::TableFunction>::FunctionSet
            (&local_1918,&scan_fun.super_FunctionSet<duckdb::TableFunction>);
  ExtensionUtil::RegisterFunction(pDVar1,(TableFunctionSet *)&local_1918);
  FunctionSet<duckdb::TableFunction>::~FunctionSet(&local_1918);
  ::std::__cxx11::string::assign((char *)&scan_fun);
  FunctionSet<duckdb::TableFunction>::FunctionSet
            (&local_1950,&scan_fun.super_FunctionSet<duckdb::TableFunction>);
  ExtensionUtil::RegisterFunction(pDVar1,(TableFunctionSet *)&local_1950);
  FunctionSet<duckdb::TableFunction>::~FunctionSet(&local_1950);
  ParquetMetaDataFunction::ParquetMetaDataFunction(&meta_fun);
  TableFunction::TableFunction(&local_640,&meta_fun.super_TableFunction);
  MultiFileReader::CreateFunctionSet((TableFunctionSet *)&local_1988,&local_640);
  ExtensionUtil::RegisterFunction(pDVar1,(TableFunctionSet *)&local_1988);
  FunctionSet<duckdb::TableFunction>::~FunctionSet(&local_1988);
  TableFunction::~TableFunction(&local_640);
  ParquetSchemaFunction::ParquetSchemaFunction(&schema_fun);
  TableFunction::TableFunction(&local_9b0,&schema_fun.super_TableFunction);
  MultiFileReader::CreateFunctionSet((TableFunctionSet *)&local_19c0,&local_9b0);
  ExtensionUtil::RegisterFunction(pDVar1,(TableFunctionSet *)&local_19c0);
  FunctionSet<duckdb::TableFunction>::~FunctionSet(&local_19c0);
  TableFunction::~TableFunction(&local_9b0);
  ParquetKeyValueMetadataFunction::ParquetKeyValueMetadataFunction(&kv_meta_fun);
  TableFunction::TableFunction(&local_d20,&kv_meta_fun.super_TableFunction);
  MultiFileReader::CreateFunctionSet((TableFunctionSet *)&local_19f8,&local_d20);
  ExtensionUtil::RegisterFunction(pDVar1,(TableFunctionSet *)&local_19f8);
  FunctionSet<duckdb::TableFunction>::~FunctionSet(&local_19f8);
  TableFunction::~TableFunction(&local_d20);
  ParquetFileMetadataFunction::ParquetFileMetadataFunction(&file_meta_fun);
  TableFunction::TableFunction(&local_1090,&file_meta_fun.super_TableFunction);
  MultiFileReader::CreateFunctionSet((TableFunctionSet *)&local_1a30,&local_1090);
  ExtensionUtil::RegisterFunction(pDVar1,(TableFunctionSet *)&local_1a30);
  FunctionSet<duckdb::TableFunction>::~FunctionSet(&local_1a30);
  TableFunction::~TableFunction(&local_1090);
  ParquetBloomProbeFunction::ParquetBloomProbeFunction(&bloom_probe_fun);
  TableFunction::TableFunction(&local_1400,&bloom_probe_fun.super_TableFunction);
  MultiFileReader::CreateFunctionSet((TableFunctionSet *)&local_1a68,&local_1400);
  ExtensionUtil::RegisterFunction(pDVar1,(TableFunctionSet *)&local_1a68);
  FunctionSet<duckdb::TableFunction>::~FunctionSet(&local_1a68);
  TableFunction::~TableFunction(&local_1400);
  ::std::__cxx11::string::string((string *)&parquet_key_fun,"parquet",(allocator *)local_1c40);
  CopyFunction::CopyFunction(&function,(string *)&parquet_key_fun);
  ::std::__cxx11::string::~string((string *)&parquet_key_fun);
  function.copy_to_select = ParquetWriteSelect;
  function.copy_to_bind = ParquetWriteBind;
  function.copy_to_initialize_global = ParquetWriteInitializeGlobal;
  function.copy_to_initialize_local = ParquetWriteInitializeLocal;
  function.copy_to_get_written_statistics = ParquetWriteGetWrittenStatistics;
  function.copy_to_sink = ParquetWriteSink;
  function.copy_to_combine = ParquetWriteCombine;
  function.copy_to_finalize = ParquetWriteFinalize;
  function.execution_mode = ParquetWriteExecutionMode;
  function.copy_from_bind = MultiFileFunction<duckdb::ParquetMultiFileInfo>::MultiFileBindCopy;
  pvVar3 = vector<duckdb::TableFunction,_true>::get<true>
                     (&scan_fun.super_FunctionSet<duckdb::TableFunction>.functions,0);
  TableFunction::operator=(&function.copy_from_function,pvVar3);
  function.prepare_batch = ParquetWritePrepareBatch;
  function.flush_batch = ParquetWriteFlushBatch;
  function.desired_batch_size = ParquetWriteDesiredBatchSize;
  function.rotate_files = ParquetWriteRotateFiles;
  function.rotate_next_file = ParquetWriteRotateNextFile;
  function.serialize = ParquetCopySerialize;
  function.deserialize = ParquetCopyDeserialize;
  ::std::__cxx11::string::assign((char *)&function.extension);
  CopyFunction::CopyFunction(&local_2d0,&function);
  ExtensionUtil::RegisterFunction(pDVar1,&local_2d0);
  CopyFunction::~CopyFunction(&local_2d0);
  ::std::__cxx11::string::string((string *)&local_1c68,"add_parquet_key",&local_1c69);
  LogicalType::LogicalType((LogicalType *)local_1c40,VARCHAR);
  LogicalType::LogicalType((LogicalType *)(local_1c40 + 0x18),VARCHAR);
  __l._M_len = 2;
  __l._M_array = (iterator)local_1c40;
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&local_1b58,__l,&local_1c6a);
  LogicalType::LogicalType(&local_1b70,INVALID);
  PragmaFunction::PragmaCall
            (&parquet_key_fun,&local_1c68,ParquetCrypto::AddKey,
             (vector<duckdb::LogicalType,_true> *)&local_1b58,&local_1b70);
  LogicalType::~LogicalType(&local_1b70);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_1b58);
  lVar4 = 0x18;
  do {
    LogicalType::~LogicalType((LogicalType *)(local_1c40 + lVar4));
    lVar4 = lVar4 + -0x18;
  } while (lVar4 != -0x18);
  ::std::__cxx11::string::~string((string *)&local_1c68);
  PragmaFunction::PragmaFunction(&local_1518,&parquet_key_fun);
  ExtensionUtil::RegisterFunction(pDVar1,&local_1518);
  PragmaFunction::~PragmaFunction(&local_1518);
  pDVar1 = shared_ptr<duckdb::DatabaseInstance,_true>::operator*(&db->instance);
  this_00 = DBConfig::GetConfig(pDVar1);
  ::std::vector<duckdb::ReplacementScan,std::allocator<duckdb::ReplacementScan>>::
  emplace_back<duckdb::unique_ptr<duckdb::TableRef,std::default_delete<duckdb::TableRef>,true>(&)(duckdb::ClientContext&,duckdb::ReplacementScanInput&,duckdb::optional_ptr<duckdb::ReplacementScanData,true>)>
            ((vector<duckdb::ReplacementScan,std::allocator<duckdb::ReplacementScan>> *)
             &this_00->replacement_scans,ParquetScanReplacement);
  ::std::__cxx11::string::string((string *)&local_1c68,"binary_as_string",&local_1c69);
  ::std::__cxx11::string::string
            ((string *)&local_1ac0,"In Parquet files, interpret binary data as a string.",
             (allocator *)&local_1c6a);
  LogicalType::LogicalType(&local_1b88,BOOLEAN);
  LogicalType::LogicalType(&local_1ba0,SQLNULL);
  Value::Value((Value *)local_1c40,&local_1ba0);
  DBConfig::AddExtensionOption
            (this_00,&local_1c68,&local_1ac0,&local_1b88,(Value *)local_1c40,
             (set_option_callback_t)0x0);
  Value::~Value((Value *)local_1c40);
  LogicalType::~LogicalType(&local_1ba0);
  LogicalType::~LogicalType(&local_1b88);
  ::std::__cxx11::string::~string((string *)&local_1ac0);
  ::std::__cxx11::string::~string((string *)&local_1c68);
  ::std::__cxx11::string::string((string *)&local_1c68,"disable_parquet_prefetching",&local_1c69);
  ::std::__cxx11::string::string
            ((string *)&local_1ae0,"Disable the prefetching mechanism in Parquet",
             (allocator *)&local_1c6a);
  LogicalType::LogicalType(&local_1bb8,BOOLEAN);
  Value::Value((Value *)local_1c40,false);
  DBConfig::AddExtensionOption
            (this_00,&local_1c68,&local_1ae0,&local_1bb8,(Value *)local_1c40,
             (set_option_callback_t)0x0);
  Value::~Value((Value *)local_1c40);
  LogicalType::~LogicalType(&local_1bb8);
  ::std::__cxx11::string::~string((string *)&local_1ae0);
  ::std::__cxx11::string::~string((string *)&local_1c68);
  ::std::__cxx11::string::string((string *)&local_1c68,"prefetch_all_parquet_files",&local_1c69);
  ::std::__cxx11::string::string
            ((string *)&local_1b00,"Use the prefetching mechanism for all types of parquet files",
             (allocator *)&local_1c6a);
  LogicalType::LogicalType(&local_1bd0,BOOLEAN);
  Value::Value((Value *)local_1c40,false);
  DBConfig::AddExtensionOption
            (this_00,&local_1c68,&local_1b00,&local_1bd0,(Value *)local_1c40,
             (set_option_callback_t)0x0);
  Value::~Value((Value *)local_1c40);
  LogicalType::~LogicalType(&local_1bd0);
  ::std::__cxx11::string::~string((string *)&local_1b00);
  ::std::__cxx11::string::~string((string *)&local_1c68);
  ::std::__cxx11::string::string((string *)&local_1c68,"parquet_metadata_cache",&local_1c69);
  ::std::__cxx11::string::string
            ((string *)&local_1b20,
             "Cache Parquet metadata - useful when reading the same files multiple times",
             (allocator *)&local_1c6a);
  LogicalType::LogicalType(&local_1be8,BOOLEAN);
  Value::Value((Value *)local_1c40,false);
  DBConfig::AddExtensionOption
            (this_00,&local_1c68,&local_1b20,&local_1be8,(Value *)local_1c40,
             (set_option_callback_t)0x0);
  Value::~Value((Value *)local_1c40);
  LogicalType::~LogicalType(&local_1be8);
  ::std::__cxx11::string::~string((string *)&local_1b20);
  ::std::__cxx11::string::~string((string *)&local_1c68);
  ::std::__cxx11::string::string((string *)&local_1c68,"enable_geoparquet_conversion",&local_1c69);
  ::std::__cxx11::string::string
            ((string *)&local_1b40,
             "Attempt to decode/encode geometry data in/as GeoParquet files if the spatial extension is present."
             ,(allocator *)&local_1c6a);
  LogicalType::LogicalType(&local_1c00,BOOLEAN);
  Value::BOOLEAN((Value *)local_1c40,true);
  DBConfig::AddExtensionOption
            (this_00,&local_1c68,&local_1b40,&local_1c00,(Value *)local_1c40,
             (set_option_callback_t)0x0);
  Value::~Value((Value *)local_1c40);
  LogicalType::~LogicalType(&local_1c00);
  ::std::__cxx11::string::~string((string *)&local_1b40);
  ::std::__cxx11::string::~string((string *)&local_1c68);
  PragmaFunction::~PragmaFunction(&parquet_key_fun);
  CopyFunction::~CopyFunction(&function);
  TableFunction::~TableFunction(&bloom_probe_fun.super_TableFunction);
  TableFunction::~TableFunction(&file_meta_fun.super_TableFunction);
  TableFunction::~TableFunction(&kv_meta_fun.super_TableFunction);
  TableFunction::~TableFunction(&schema_fun.super_TableFunction);
  TableFunction::~TableFunction(&meta_fun.super_TableFunction);
  FunctionSet<duckdb::TableFunction>::~FunctionSet
            (&scan_fun.super_FunctionSet<duckdb::TableFunction>);
  return;
}

Assistant:

void ParquetExtension::Load(DuckDB &db) {
	auto &db_instance = *db.instance;
	auto &fs = db.GetFileSystem();
	fs.RegisterSubSystem(FileCompressionType::ZSTD, make_uniq<ZStdFileSystem>());

	auto scan_fun = ParquetScanFunction::GetFunctionSet();
	scan_fun.name = "read_parquet";
	ExtensionUtil::RegisterFunction(db_instance, scan_fun);
	scan_fun.name = "parquet_scan";
	ExtensionUtil::RegisterFunction(db_instance, scan_fun);

	// parquet_metadata
	ParquetMetaDataFunction meta_fun;
	ExtensionUtil::RegisterFunction(db_instance, MultiFileReader::CreateFunctionSet(meta_fun));

	// parquet_schema
	ParquetSchemaFunction schema_fun;
	ExtensionUtil::RegisterFunction(db_instance, MultiFileReader::CreateFunctionSet(schema_fun));

	// parquet_key_value_metadata
	ParquetKeyValueMetadataFunction kv_meta_fun;
	ExtensionUtil::RegisterFunction(db_instance, MultiFileReader::CreateFunctionSet(kv_meta_fun));

	// parquet_file_metadata
	ParquetFileMetadataFunction file_meta_fun;
	ExtensionUtil::RegisterFunction(db_instance, MultiFileReader::CreateFunctionSet(file_meta_fun));

	// parquet_bloom_probe
	ParquetBloomProbeFunction bloom_probe_fun;
	ExtensionUtil::RegisterFunction(db_instance, MultiFileReader::CreateFunctionSet(bloom_probe_fun));

	CopyFunction function("parquet");
	function.copy_to_select = ParquetWriteSelect;
	function.copy_to_bind = ParquetWriteBind;
	function.copy_to_initialize_global = ParquetWriteInitializeGlobal;
	function.copy_to_initialize_local = ParquetWriteInitializeLocal;
	function.copy_to_get_written_statistics = ParquetWriteGetWrittenStatistics;
	function.copy_to_sink = ParquetWriteSink;
	function.copy_to_combine = ParquetWriteCombine;
	function.copy_to_finalize = ParquetWriteFinalize;
	function.execution_mode = ParquetWriteExecutionMode;
	function.copy_from_bind = MultiFileFunction<ParquetMultiFileInfo>::MultiFileBindCopy;
	function.copy_from_function = scan_fun.functions[0];
	function.prepare_batch = ParquetWritePrepareBatch;
	function.flush_batch = ParquetWriteFlushBatch;
	function.desired_batch_size = ParquetWriteDesiredBatchSize;
	function.rotate_files = ParquetWriteRotateFiles;
	function.rotate_next_file = ParquetWriteRotateNextFile;
	function.serialize = ParquetCopySerialize;
	function.deserialize = ParquetCopyDeserialize;

	function.extension = "parquet";
	ExtensionUtil::RegisterFunction(db_instance, function);

	// parquet_key
	auto parquet_key_fun = PragmaFunction::PragmaCall("add_parquet_key", ParquetCrypto::AddKey,
	                                                  {LogicalType::VARCHAR, LogicalType::VARCHAR});
	ExtensionUtil::RegisterFunction(db_instance, parquet_key_fun);

	auto &config = DBConfig::GetConfig(*db.instance);
	config.replacement_scans.emplace_back(ParquetScanReplacement);
	config.AddExtensionOption("binary_as_string", "In Parquet files, interpret binary data as a string.",
	                          LogicalType::BOOLEAN);
	config.AddExtensionOption("disable_parquet_prefetching", "Disable the prefetching mechanism in Parquet",
	                          LogicalType::BOOLEAN, Value(false));
	config.AddExtensionOption("prefetch_all_parquet_files",
	                          "Use the prefetching mechanism for all types of parquet files", LogicalType::BOOLEAN,
	                          Value(false));
	config.AddExtensionOption("parquet_metadata_cache",
	                          "Cache Parquet metadata - useful when reading the same files multiple times",
	                          LogicalType::BOOLEAN, Value(false));
	config.AddExtensionOption(
	    "enable_geoparquet_conversion",
	    "Attempt to decode/encode geometry data in/as GeoParquet files if the spatial extension is present.",
	    LogicalType::BOOLEAN, Value::BOOLEAN(true));
}